

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo.cxx
# Opt level: O2

void undo_cb(Fl_Widget *param_1,void *param_2)

{
  int iVar1;
  int in_EDX;
  int extraout_EDX;
  char filename [2048];
  char acStack_808 [2048];
  
  if (0 < undo_current) {
    if (undo_current == undo_last) {
      undo_filename(undo_current,acStack_808,in_EDX);
      write_file(acStack_808,0);
      in_EDX = extraout_EDX;
    }
    undo_paused = 1;
    undo_filename(undo_current + -1,acStack_808,in_EDX);
    iVar1 = read_file(acStack_808,0);
    if (iVar1 != 0) {
      undo_current = undo_current + -1;
      set_modflag((uint)(undo_current != undo_save));
      if (undo_current < 1) {
        Main_Menu[0x19].flags._0_1_ = (byte)Main_Menu[0x19].flags | 1;
      }
      Main_Menu[0x1a].flags._0_1_ = (byte)Main_Menu[0x1a].flags & 0xfe;
    }
    undo_paused = 0;
  }
  return;
}

Assistant:

void undo_cb(Fl_Widget *, void *) {
  char	filename[FL_PATH_MAX];			// Undo checkpoint file

  if (undo_current <= 0) return;

  if (undo_current == undo_last) {
    write_file(undo_filename(undo_current, filename, sizeof(filename)));
  }

  undo_suspend();
  if (!read_file(undo_filename(undo_current - 1, filename, sizeof(filename)), 0)) {
    // Unable to read checkpoint file, don't undo...
    undo_resume();
    return;
  }

  undo_current --;

  // Update modified flag...
  set_modflag(undo_current != undo_save);

  // Update undo/redo menu items...
  if (undo_current <= 0) Main_Menu[UNDO_ITEM].deactivate();
  Main_Menu[REDO_ITEM].activate();
  undo_resume();
}